

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_create_adopt_udp2(lws *wsi,char *ads,addrinfo *r,int n,void *opaque)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  lws_sock_file_fd_type lVar4;
  uint16_t uVar5;
  int iVar6;
  int *piVar7;
  lws *plVar8;
  uint *puVar9;
  addrinfo *local_60;
  uint local_4c;
  int local_44;
  undefined4 local_40;
  lws_sock_file_fd_type local_3c;
  int bc;
  lws_sock_file_fd_type sock;
  void *opaque_local;
  addrinfo *paStack_28;
  int n_local;
  addrinfo *r_local;
  char *ads_local;
  lws *wsi_local;
  
  local_40 = 1;
  _bc = (char *)opaque;
  opaque_local._4_4_ = n;
  paStack_28 = r;
  r_local = (addrinfo *)ads;
  ads_local = (char *)wsi;
  if (wsi == (lws *)0x0) {
    __assert_fail("wsi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/adopt.c"
                  ,0x1d0,
                  "struct lws *lws_create_adopt_udp2(struct lws *, const char *, const struct addrinfo *, int, void *)"
                 );
  }
  if (wsi->dns_results == (addrinfo *)0x0) {
    wsi->dns_results = r;
    wsi->dns_results_next = r;
  }
  if ((ads == (char *)0x0) || ((-1 < n && (r != (addrinfo *)0x0)))) {
    while (*(long *)(ads_local + 0x260) != 0) {
      if ((*(ulong *)(ads_local + 0x2dc) >> 9 & 1) == 0) {
        local_44 = *(int *)(*(long *)(ads_local + 0x260) + 4);
      }
      else {
        local_44 = 0x11;
      }
      if ((*(ulong *)(ads_local + 0x2dc) >> 9 & 1) == 0) {
        local_4c = 0x11;
      }
      else {
        uVar5 = htons(0x800);
        local_4c = (uint)uVar5;
      }
      local_3c.sockfd = socket(local_44,2,local_4c);
      if (local_3c.sockfd != 0xffffffff) {
        uVar5 = htons(*(uint16_t *)(ads_local + 0x2e6));
        *(uint16_t *)(*(long *)(*(long *)(ads_local + 0x260) + 0x18) + 2) = uVar5;
        iVar6 = setsockopt(local_3c.sockfd,1,2,&local_40,4);
        if (iVar6 < 0) {
          _lws_log(1,"%s: failed to set reuse\n","lws_create_adopt_udp2");
        }
        if (((*(ulong *)(ads_local + 0x2dc) >> 10 & 1) != 0) &&
           (iVar6 = setsockopt(local_3c.sockfd,1,6,&local_40,4), iVar6 < 0)) {
          _lws_log(1,"%s: failed to set broadcast\n","lws_create_adopt_udp2");
        }
        if ((_bc == (char *)0x0) || (iVar6 = lws_plat_BINDTODEVICE(local_3c.sockfd,_bc), iVar6 == 0)
           ) {
          if (((*(ulong *)(ads_local + 0x2dc) >> 0x27 & 1) == 0) ||
             (iVar6 = bind(local_3c.sockfd,*(sockaddr **)(*(long *)(ads_local + 0x260) + 0x18),0x10)
             , iVar6 != -1)) {
            if (((*(ulong *)(ads_local + 0x2dc) >> 0x27 & 1) != 0) ||
               ((*(ulong *)(ads_local + 0x2dc) >> 9 & 1) != 0)) {
LAB_00153fb1:
              lws_addrinfo_clean((lws *)ads_local);
              plVar8 = lws_adopt_descriptor_vhost2
                                 ((lws *)ads_local,LWS_ADOPT_RAW_SOCKET_UDP,local_3c);
              return plVar8;
            }
            iVar6 = connect(local_3c.sockfd,*(sockaddr **)(*(long *)(ads_local + 0x260) + 0x18),
                            *(socklen_t *)(*(long *)(ads_local + 0x260) + 0x10));
            lVar4 = local_3c;
            if (iVar6 != -1) {
              memcpy(*(void **)(ads_local + 0x240),*(void **)(*(long *)(ads_local + 0x260) + 0x18),
                     (ulong)*(uint *)(*(long *)(ads_local + 0x260) + 0x10));
              *(undefined4 *)(*(long *)(ads_local + 0x240) + 0x10) =
                   *(undefined4 *)(*(long *)(ads_local + 0x260) + 0x10);
              goto LAB_00153fb1;
            }
            uVar1 = **(ushort **)(*(long *)(ads_local + 0x260) + 0x18);
            if (r_local == (addrinfo *)0x0) {
              local_60 = (addrinfo *)0x160ece;
            }
            else {
              local_60 = r_local;
            }
            uVar2 = *(ushort *)(ads_local + 0x2e6);
            uVar3 = *(undefined4 *)(*(long *)(ads_local + 0x260) + 0x10);
            piVar7 = __errno_location();
            _lws_log(1,"%s: conn fd %d fam %d %s:%u failed (salen %d) errno %d\n",
                     "lws_create_adopt_udp2",(ulong)(uint)lVar4.sockfd,(ulong)uVar1,local_60,
                     (uint)uVar2,uVar3,*piVar7);
            close(local_3c.sockfd);
          }
          else {
            _lws_log(1,"%s: bind failed\n","lws_create_adopt_udp2");
          }
        }
      }
      *(undefined8 *)(ads_local + 0x260) = *(undefined8 *)(*(long *)(ads_local + 0x260) + 0x28);
    }
    puVar9 = (uint *)__errno_location();
    _lws_log(1,"%s: unable to create INET socket %d\n","lws_create_adopt_udp2",(ulong)*puVar9);
    lws_addrinfo_clean((lws *)ads_local);
  }
  else {
    _lws_log(4,"%s: bad: n %d, r %p\n","lws_create_adopt_udp2",(ulong)(uint)n,r);
    ads_local[600] = '\0';
    ads_local[0x259] = '\0';
    ads_local[0x25a] = '\0';
    ads_local[0x25b] = '\0';
    ads_local[0x25c] = '\0';
    ads_local[0x25d] = '\0';
    ads_local[0x25e] = '\0';
    ads_local[0x25f] = '\0';
    ads_local[0x260] = '\0';
    ads_local[0x261] = '\0';
    ads_local[0x262] = '\0';
    ads_local[0x263] = '\0';
    ads_local[0x264] = '\0';
    ads_local[0x265] = '\0';
    ads_local[0x266] = '\0';
    ads_local[0x267] = '\0';
  }
  lws_close_free_wsi((lws *)ads_local,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_create_adopt_udp2(struct lws *wsi, const char *ads,
		      const struct addrinfo *r, int n, void *opaque)
{
	lws_sock_file_fd_type sock;
	int bc = 1;

	assert(wsi);

	if (!wsi->dns_results)
		wsi->dns_results_next = wsi->dns_results = r;

	if (ads && (n < 0 || !r)) {
		/*
		 * DNS lookup failed: there are no usable results.  Fail the
		 * overall connection request.
		 */
		lwsl_notice("%s: bad: n %d, r %p\n", __func__, n, r);

		/*
		 * We didn't get a callback on a cache item and bump the
		 * refcount.  So don't let the cleanup continue to think it
		 * needs to decrement any refcount.
		 */
		wsi->dns_results_next = wsi->dns_results = NULL;
		goto bail;
	}

	while (wsi->dns_results_next) {

		/*
		 * We have done the dns lookup, identify the result we want
		 * if any, and then complete the adoption by binding wsi to
		 * socket opened on it.
		 *
		 * Ignore the weak assumptions about protocol driven by port
		 * number and force to DGRAM / UDP since that's what this
		 * function is for.
		 */

#if !defined(__linux__)
		/* PF_PACKET is linux-only */
		sock.sockfd = socket(wsi->dns_results_next->ai_family,
				     SOCK_DGRAM, IPPROTO_UDP);
#else
		sock.sockfd = socket(wsi->pf_packet ? PF_PACKET :
					wsi->dns_results_next->ai_family,
				     SOCK_DGRAM, wsi->pf_packet ?
					htons(0x800) : IPPROTO_UDP);
#endif
		if (sock.sockfd == LWS_SOCK_INVALID)
			goto resume;

		((struct sockaddr_in *)wsi->dns_results_next->ai_addr)->sin_port =
				htons(wsi->c_port);

		if (setsockopt(sock.sockfd, SOL_SOCKET, SO_REUSEADDR, (const char *)&bc,
			       sizeof(bc)) < 0)
			lwsl_err("%s: failed to set reuse\n", __func__);

		if (wsi->do_broadcast &&
		    setsockopt(sock.sockfd, SOL_SOCKET, SO_BROADCAST, (const char *)&bc,
			       sizeof(bc)) < 0)
				lwsl_err("%s: failed to set broadcast\n",
						__func__);

		/* Bind the udp socket to a particular network interface */

		if (opaque &&
		    lws_plat_BINDTODEVICE(sock.sockfd, (const char *)opaque))
			goto resume;

		if (wsi->do_bind &&
		    bind(sock.sockfd, wsi->dns_results_next->ai_addr,
#if defined(_WIN32)
			 (int)wsi->dns_results_next->ai_addrlen
#else
			 sizeof(struct sockaddr)//wsi->dns_results_next->ai_addrlen
#endif
								    ) == -1) {
			lwsl_err("%s: bind failed\n", __func__);
			goto resume;
		}

		if (!wsi->do_bind && !wsi->pf_packet) {

			if (connect(sock.sockfd, wsi->dns_results_next->ai_addr,
				     (socklen_t)wsi->dns_results_next->ai_addrlen) == -1) {
				lwsl_err("%s: conn fd %d fam %d %s:%u failed "
					 "(salen %d) errno %d\n", __func__,
					 sock.sockfd,
					 wsi->dns_results_next->ai_addr->sa_family,
					 ads ? ads : "null", wsi->c_port,
					 (int)wsi->dns_results_next->ai_addrlen,
					 LWS_ERRNO);
				compatible_close(sock.sockfd);
				goto resume;
			}

			memcpy(&wsi->udp->sa, wsi->dns_results_next->ai_addr,
			       wsi->dns_results_next->ai_addrlen);
			wsi->udp->salen = (socklen_t)wsi->dns_results_next->ai_addrlen;
		}

		/* we connected: complete the udp socket adoption flow */

		lws_addrinfo_clean(wsi);
		return lws_adopt_descriptor_vhost2(wsi,
						LWS_ADOPT_RAW_SOCKET_UDP, sock);

resume:
		wsi->dns_results_next = wsi->dns_results_next->ai_next;
	}

	lwsl_err("%s: unable to create INET socket %d\n", __func__, LWS_ERRNO);
	lws_addrinfo_clean(wsi);

bail:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "adopt udp2 fail");

	return NULL;
}